

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O0

uint id3_fill_comment(uchar *buf,uint len,uchar encoding,char *short_comment,char *long_comment,
                     char *language)

{
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  uchar *__dest;
  ulong local_60;
  ulong local_58;
  uchar *puStack_48;
  uint flen;
  uchar *ptr;
  uint long_len;
  uint short_len;
  char *language_local;
  char *long_comment_local;
  char *short_comment_local;
  uchar encoding_local;
  uint len_local;
  uchar *buf_local;
  
  if (buf == (uchar *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x22,
                  "unsigned int id3_fill_comment(unsigned char *, unsigned int, unsigned char, char *, char *, char *)"
                 );
  }
  if (len != 0) {
    if ((short_comment == (char *)0x0) && (long_comment == (char *)0x0)) {
      buf_local._4_4_ = 0;
    }
    else {
      _long_len = language;
      if (language == (char *)0x0) {
        _long_len = "eng";
      }
      if (short_comment == (char *)0x0) {
        local_58 = 0;
      }
      else {
        local_58 = strlen(short_comment);
      }
      if (long_comment == (char *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = strlen(long_comment);
      }
      iVar1 = (int)local_58 + (int)local_60;
      uVar2 = iVar1 + 6;
      if (len < iVar1 + 0xcU) {
        buf_local._4_4_ = 0;
      }
      else {
        buf[0] = 'C';
        buf[1] = 'O';
        buf[2] = 'M';
        uVar3 = id3_sync_safe((ulong)uVar2);
        buf[3] = (uchar)(uVar3 >> 0x10);
        uVar3 = id3_sync_safe((ulong)uVar2);
        buf[4] = (uchar)(uVar3 >> 8);
        uVar3 = id3_sync_safe((ulong)uVar2);
        buf[5] = (uchar)uVar3;
        buf[6] = encoding;
        *(undefined2 *)(buf + 7) = *(undefined2 *)_long_len;
        buf[9] = _long_len[2];
        puStack_48 = buf + 10;
        if (short_comment != (char *)0x0) {
          memcpy(puStack_48,short_comment,local_58 & 0xffffffff);
          puStack_48 = puStack_48 + (local_58 & 0xffffffff);
        }
        __dest = puStack_48 + 1;
        *puStack_48 = '\0';
        puStack_48 = __dest;
        if (long_comment != (char *)0x0) {
          memcpy(__dest,long_comment,local_60 & 0xffffffff);
          puStack_48 = __dest + (local_60 & 0xffffffff);
        }
        *puStack_48 = '\0';
        buf_local._4_4_ = iVar1 + 0xc;
      }
    }
    return buf_local._4_4_;
  }
  __assert_fail("len > 0","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",0x23
                ,
                "unsigned int id3_fill_comment(unsigned char *, unsigned int, unsigned char, char *, char *, char *)"
               );
}

Assistant:

unsigned int id3_fill_comment(unsigned char *buf, unsigned int len,
                              unsigned char encoding,
                              char *short_comment,
                              char *long_comment,
                              char *language) {
  assert(buf != NULL);
  assert(len > 0);
  if ((short_comment == NULL) &&
      (long_comment == NULL))
    return 0;
  if (language == NULL)
    language = "eng";

  unsigned int short_len = short_comment ? strlen(short_comment) : 0;
  unsigned int long_len  = long_comment  ? strlen(long_comment)  : 0;
  
  unsigned char *ptr = buf;
  unsigned int flen = 1 + 3 + short_len + 1 + long_len + 1;
  if (len < 6 + flen)
    return 0;
  memcpy(ptr, "COM", 3); ptr += 3;
  UINT24_PACK(ptr, id3_sync_safe(flen));
  UINT8_PACK(ptr, encoding);
  memcpy(ptr, language, 3); ptr += 3;
  if (short_comment) {
    memcpy(ptr, short_comment, short_len);
    ptr += short_len;
  }
  UINT8_PACK(ptr, 0x00);
  if (long_comment) {
    memcpy(ptr, long_comment, long_len);
    ptr += long_len;
  }
  UINT8_PACK(ptr, 0x00);

  return 6 + flen;
}